

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
 __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::parser::parse_internal(parser *this,bool keep)

{
  lexer *plVar1;
  parser *this_00;
  value_t vVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  token_type tVar6;
  undefined8 *puVar7;
  reference this_01;
  undefined8 uVar8;
  byte in_DL;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value extraout_RDX_01;
  json_value extraout_RDX_02;
  json_value extraout_RDX_03;
  json_value extraout_RDX_04;
  json_value extraout_RDX_05;
  json_value extraout_RDX_06;
  json_value extraout_RDX_07;
  json_value extraout_RDX_08;
  json_value extraout_RDX_09;
  json_value extraout_RDX_10;
  json_value extraout_RDX_11;
  json_value extraout_RDX_12;
  json_value extraout_RDX_13;
  json_value extraout_RDX_14;
  json_value extraout_RDX_15;
  json_value jVar9;
  int iVar10;
  undefined7 in_register_00000031;
  parser *this_02;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbVar11;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  bVar12;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  value_1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  value;
  parse_event_t local_e9;
  parser *local_e8;
  undefined1 local_e0 [56];
  json_value local_a8;
  uint local_a0;
  int local_9c;
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  undefined1 local_80 [16];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_70;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_60;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_50;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_40;
  
  this_02 = (parser *)CONCAT71(in_register_00000031,keep);
  *(undefined1 *)&this->depth = 8;
  assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)this);
  tVar6 = this_02->last_token;
  switch(tVar6) {
  case literal_true:
    tVar6 = lexer::scan(&this_02->m_lexer);
    this_02->last_token = tVar6;
    *(undefined1 *)&this->depth = 4;
    *(undefined8 *)&(this->callback).super__Function_base._M_functor = 1;
    jVar9 = extraout_RDX_07;
    break;
  case literal_false:
    tVar6 = lexer::scan(&this_02->m_lexer);
    this_02->last_token = tVar6;
    *(undefined1 *)&this->depth = 4;
    *(undefined8 *)&(this->callback).super__Function_base._M_functor = 0;
    jVar9 = extraout_RDX_08;
    break;
  case literal_null:
    tVar6 = lexer::scan(&this_02->m_lexer);
    this_02->last_token = tVar6;
    *(undefined1 *)&this->depth = 0;
    jVar9 = extraout_RDX_02;
    break;
  case value_string:
    lexer::get_string((string_t *)(local_e0 + 0x10),&this_02->m_lexer);
    tVar6 = lexer::scan(&this_02->m_lexer);
    this_02->last_token = tVar6;
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)(local_98 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_e0 + 0x10));
    assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)(local_98 + 8));
    iVar10 = this->depth;
    *(undefined1 *)&this->depth = local_98[8];
    pcVar3 = *(pointer *)&(this->callback).super__Function_base._M_functor;
    *(pointer *)&(this->callback).super__Function_base._M_functor = local_88._M_p;
    local_98[8] = (char)iVar10;
    local_88._M_p = pcVar3;
    assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)this);
    ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)(local_98 + 8));
    jVar9 = extraout_RDX_03;
    if ((undefined1 *)CONCAT44(local_e0._20_4_,local_e0._16_4_) != local_e0 + 0x20) {
      operator_delete((undefined1 *)CONCAT44(local_e0._20_4_,local_e0._16_4_),
                      (ulong)(local_e0._32_8_ + 1));
      jVar9 = extraout_RDX_04;
    }
    break;
  case value_unsigned:
  case value_integer:
  case value_float:
    lexer::get_number(&this_02->m_lexer,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)this,tVar6);
    tVar6 = lexer::scan(&this_02->m_lexer);
    this_02->last_token = tVar6;
    jVar9 = extraout_RDX;
    break;
  case begin_array:
    if (in_DL != 0) {
      if ((this_02->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_e0._16_4_ = this_02->depth;
        this_02->depth = local_e0._16_4_ + 1;
        local_e0[0] = array_start;
        in_DL = (*(this_02->callback)._M_invoker)
                          ((_Any_data *)&this_02->callback,(int *)(local_e0 + 0x10),local_e0,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)this);
        if (!(bool)in_DL) goto LAB_0010e4a5;
      }
      *(undefined1 *)&this->depth = 2;
      puVar7 = (undefined8 *)operator_new(0x18);
      *puVar7 = 0;
      puVar7[1] = 0;
      puVar7[2] = 0;
      *(undefined8 **)&(this->callback).super__Function_base._M_functor = puVar7;
    }
LAB_0010e4a5:
    plVar1 = &this_02->m_lexer;
    tVar6 = lexer::scan(plVar1);
    this_02->last_token = tVar6;
    if (tVar6 == end_array) {
      tVar6 = lexer::scan(plVar1);
      this_02->last_token = tVar6;
      jVar9 = extraout_RDX_00;
      if ((this_02->callback).super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_0010ea0c;
      local_e0._16_4_ = this_02->depth + -1;
      this_02->depth = local_e0._16_4_;
      local_e0[0] = array_end;
      bVar5 = (*(this_02->callback)._M_invoker)
                        ((_Any_data *)&this_02->callback,(int *)(local_e0 + 0x10),local_e0,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)this);
      jVar9 = extraout_RDX_01;
      if (bVar5) goto LAB_0010ea0c;
      pbVar11 = &local_60;
    }
    else {
      unexpect(this_02,value_separator);
      this_00 = (parser *)(local_e0 + 0x10);
      do {
        if (this_02->last_token == value_separator) {
          tVar6 = lexer::scan(plVar1);
          this_02->last_token = tVar6;
        }
        parse_internal(this_00,keep);
        if ((local_e0[0x10] != '\b' & in_DL) == 1) {
          push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)this_00);
        }
        ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)this_00);
      } while (this_02->last_token == value_separator);
      expect(this_02,end_array);
      tVar6 = lexer::scan(plVar1);
      this_02->last_token = tVar6;
      jVar9 = extraout_RDX_11;
      if ((in_DL & (this_02->callback).super__Function_base._M_manager != (_Manager_type)0x0) != 1)
      goto LAB_0010ea0c;
      iVar10 = this_02->depth + -1;
      this_02->depth = iVar10;
      bVar5 = std::
              function<bool_(int,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::operator()(&this_02->callback,iVar10,array_end,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)this);
      jVar9 = extraout_RDX_12;
      if (bVar5) goto LAB_0010ea0c;
      pbVar11 = &local_70;
    }
    goto LAB_0010e9ed;
  case begin_object:
    if (in_DL != 0) {
      if ((this_02->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_e0._16_4_ = this_02->depth;
        this_02->depth = local_e0._16_4_ + 1;
        local_e0[0] = object_start;
        in_DL = (*(this_02->callback)._M_invoker)
                          ((_Any_data *)&this_02->callback,(int *)(local_e0 + 0x10),local_e0,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)this);
        if (!(bool)in_DL) goto LAB_0010e613;
      }
      *(undefined1 *)&this->depth = 1;
      puVar7 = (undefined8 *)operator_new(0x30);
      puVar7[2] = 0;
      puVar7[3] = 0;
      puVar7[4] = 0;
      puVar7[5] = 0;
      *puVar7 = 0;
      puVar7[1] = 0;
      puVar7[3] = puVar7 + 1;
      puVar7[4] = puVar7 + 1;
      puVar7[5] = 0;
      *(undefined8 **)&(this->callback).super__Function_base._M_functor = puVar7;
    }
LAB_0010e613:
    plVar1 = &this_02->m_lexer;
    tVar6 = lexer::scan(plVar1);
    this_02->last_token = tVar6;
    if (tVar6 == end_object) {
      tVar6 = lexer::scan(plVar1);
      this_02->last_token = tVar6;
      jVar9 = extraout_RDX_05;
      if ((in_DL & (this_02->callback).super__Function_base._M_manager != (_Manager_type)0x0) != 1)
      goto LAB_0010ea0c;
      iVar10 = this_02->depth + -1;
      this_02->depth = iVar10;
      bVar5 = std::
              function<bool_(int,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::operator()(&this_02->callback,iVar10,object_end,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)this);
      jVar9 = extraout_RDX_06;
      if (bVar5) goto LAB_0010ea0c;
      pbVar11 = &local_40;
    }
    else {
      unexpect(this_02,value_separator);
      local_98._0_8_ = &this_02->callback;
      local_a0 = (uint)in_DL;
      local_e8 = this;
      do {
        if (this_02->last_token == value_separator) {
          tVar6 = lexer::scan(plVar1);
          this_02->last_token = tVar6;
        }
        expect(this_02,value_string);
        lexer::get_string((string_t *)(local_e0 + 0x10),plVar1);
        if (in_DL == 0) {
          bVar5 = false;
        }
        else if ((this_02->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
          bVar5 = true;
        }
        else {
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_e0 + 0x10));
          local_9c = this_02->depth;
          local_e9 = key;
          if ((this_02->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
            uVar8 = std::__throw_bad_function_call();
            local_e8 = this;
            ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)this);
            _Unwind_Resume(uVar8);
          }
          bVar5 = (*(this_02->callback)._M_invoker)
                            ((_Any_data *)local_98._0_8_,&local_9c,&local_e9,
                             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_e0);
          ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_e0);
        }
        tVar6 = lexer::scan(plVar1);
        this_02->last_token = tVar6;
        expect(this_02,name_separator);
        tVar6 = lexer::scan(plVar1);
        this_02->last_token = tVar6;
        parse_internal((parser *)local_e0,keep);
        if (((bVar5 & in_DL) == 1) && (local_e0[0] != 8)) {
          local_e0[0x30] = local_e0[0];
          local_a8 = (json_value)local_e0._8_8_;
          assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_e0);
          local_e0[0] = object_start;
          local_e0._8_8_ = (object_t *)0x0;
          pbVar11 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)(local_e0 + 0x30);
          assert_invariant(pbVar11);
          this_01 = operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)this,(key_type *)(local_e0 + 0x10));
          assert_invariant(pbVar11);
          vVar2 = this_01->m_type;
          this_01->m_type = local_e0[0x30];
          jVar9 = this_01->m_value;
          this_01->m_value = local_a8;
          local_e0[0x30] = vVar2;
          local_a8 = jVar9;
          assert_invariant(this_01);
          ~basic_json(pbVar11);
          this = local_e8;
        }
        ~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_e0);
        if ((undefined1 *)CONCAT44(local_e0._20_4_,local_e0._16_4_) != local_e0 + 0x20) {
          operator_delete((undefined1 *)CONCAT44(local_e0._20_4_,local_e0._16_4_),
                          (ulong)(local_e0._32_8_ + 1));
        }
      } while (this_02->last_token == value_separator);
      expect(this_02,end_object);
      tVar6 = lexer::scan(plVar1);
      this_02->last_token = tVar6;
      jVar9 = extraout_RDX_13;
      if ((in_DL & (this_02->callback).super__Function_base._M_manager != (_Manager_type)0x0) != 1)
      goto LAB_0010ea0c;
      iVar10 = this_02->depth + -1;
      this_02->depth = iVar10;
      bVar5 = std::
              function<bool_(int,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::operator()((function<bool_(int,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                            *)local_98._0_8_,iVar10,object_end,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)this);
      jVar9 = extraout_RDX_14;
      if (bVar5) goto LAB_0010ea0c;
      pbVar11 = &local_50;
    }
LAB_0010e9ed:
    pbVar11->m_type = discarded;
    assert_invariant(pbVar11);
    operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)this,pbVar11);
    goto LAB_0010ea04;
  default:
    unexpect(this_02,tVar6);
    jVar9 = extraout_RDX_09;
  }
  if ((in_DL != 0) && ((this_02->callback).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_e0._16_4_ = this_02->depth;
    local_e0[0] = value;
    bVar5 = (*(this_02->callback)._M_invoker)
                      ((_Any_data *)&this_02->callback,(int *)(local_e0 + 0x10),local_e0,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)this);
    jVar9 = extraout_RDX_10;
    if (!bVar5) {
      pbVar11 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_80;
      local_80[0] = discarded;
      assert_invariant(pbVar11);
      assert_invariant(pbVar11);
      iVar10 = this->depth;
      *(value_t *)&this->depth = local_80[0];
      sVar4 = *(size_type *)&(this->callback).super__Function_base._M_functor;
      *(undefined8 *)&(this->callback).super__Function_base._M_functor = local_80._8_8_;
      local_80[0] = (value_t)iVar10;
      local_80._8_8_ = sVar4;
      assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)this);
LAB_0010ea04:
      ~basic_json(pbVar11);
      jVar9 = extraout_RDX_15;
    }
  }
LAB_0010ea0c:
  bVar12.m_value.object = jVar9.object;
  bVar12._0_8_ = this;
  return bVar12;
}

Assistant:

basic_json parse_internal(bool keep)
        {
            auto result = basic_json(value_t::discarded);

            switch (last_token)
            {
                case lexer::token_type::begin_object:
                {
                    if (keep and (not callback
                                  or ((keep = callback(depth++, parse_event_t::object_start, result)) != 0)))
                    {
                        // explicitly set result to object to cope with {}
                        result.m_type = value_t::object;
                        result.m_value = value_t::object;
                    }

                    // read next token
                    get_token();

                    // closing } -> we are done
                    if (last_token == lexer::token_type::end_object)
                    {
                        get_token();
                        if (keep and callback and not callback(--depth, parse_event_t::object_end, result))
                        {
                            result = basic_json(value_t::discarded);
                        }
                        return result;
                    }

                    // no comma is expected here
                    unexpect(lexer::token_type::value_separator);

                    // otherwise: parse key-value pairs
                    do
                    {
                        // ugly, but could be fixed with loop reorganization
                        if (last_token == lexer::token_type::value_separator)
                        {
                            get_token();
                        }

                        // store key
                        expect(lexer::token_type::value_string);
                        const auto key = m_lexer.get_string();

                        bool keep_tag = false;
                        if (keep)
                        {
                            if (callback)
                            {
                                basic_json k(key);
                                keep_tag = callback(depth, parse_event_t::key, k);
                            }
                            else
                            {
                                keep_tag = true;
                            }
                        }

                        // parse separator (:)
                        get_token();
                        expect(lexer::token_type::name_separator);

                        // parse and add value
                        get_token();
                        auto value = parse_internal(keep);
                        if (keep and keep_tag and not value.is_discarded())
                        {
                            result[key] = std::move(value);
                        }
                    }
                    while (last_token == lexer::token_type::value_separator);

                    // closing }
                    expect(lexer::token_type::end_object);
                    get_token();
                    if (keep and callback and not callback(--depth, parse_event_t::object_end, result))
                    {
                        result = basic_json(value_t::discarded);
                    }

                    return result;
                }

                case lexer::token_type::begin_array:
                {
                    if (keep and (not callback
                                  or ((keep = callback(depth++, parse_event_t::array_start, result)) != 0)))
                    {
                        // explicitly set result to object to cope with []
                        result.m_type = value_t::array;
                        result.m_value = value_t::array;
                    }

                    // read next token
                    get_token();

                    // closing ] -> we are done
                    if (last_token == lexer::token_type::end_array)
                    {
                        get_token();
                        if (callback and not callback(--depth, parse_event_t::array_end, result))
                        {
                            result = basic_json(value_t::discarded);
                        }
                        return result;
                    }

                    // no comma is expected here
                    unexpect(lexer::token_type::value_separator);

                    // otherwise: parse values
                    do
                    {
                        // ugly, but could be fixed with loop reorganization
                        if (last_token == lexer::token_type::value_separator)
                        {
                            get_token();
                        }

                        // parse value
                        auto value = parse_internal(keep);
                        if (keep and not value.is_discarded())
                        {
                            result.push_back(std::move(value));
                        }
                    }
                    while (last_token == lexer::token_type::value_separator);

                    // closing ]
                    expect(lexer::token_type::end_array);
                    get_token();
                    if (keep and callback and not callback(--depth, parse_event_t::array_end, result))
                    {
                        result = basic_json(value_t::discarded);
                    }

                    return result;
                }

                case lexer::token_type::literal_null:
                {
                    get_token();
                    result.m_type = value_t::null;
                    break;
                }

                case lexer::token_type::value_string:
                {
                    const auto s = m_lexer.get_string();
                    get_token();
                    result = basic_json(s);
                    break;
                }

                case lexer::token_type::literal_true:
                {
                    get_token();
                    result.m_type = value_t::boolean;
                    result.m_value = true;
                    break;
                }

                case lexer::token_type::literal_false:
                {
                    get_token();
                    result.m_type = value_t::boolean;
                    result.m_value = false;
                    break;
                }

                case lexer::token_type::value_unsigned:
                case lexer::token_type::value_integer:
                case lexer::token_type::value_float:
                {
                    m_lexer.get_number(result, last_token);
                    get_token();
                    break;
                }

                default:
                {
                    // the last token was unexpected
                    unexpect(last_token);
                }
            }

            if (keep and callback and not callback(depth, parse_event_t::value, result))
            {
                result = basic_json(value_t::discarded);
            }
            return result;
        }